

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-escape.c
# Opt level: O1

wchar_t borg_freedom(wchar_t y,wchar_t x)

{
  wchar_t wVar1;
  wchar_t wVar2;
  
  wVar1 = L'\0';
  if ((borg.trait[0x69] == 0) && (wVar1 = L'\0', track_more.num != 0)) {
    wVar1 = borg_distance(y * 2,x * 2,*track_more.y * 2,*track_more.x * 2);
    if (wVar1 < L'\x04') {
      wVar1 = wVar1 * -0x1f5 + L'ஸ';
    }
    else {
      wVar1 = L'Ϩ' - wVar1;
    }
  }
  if ((borg.trait[0x69] != 0) && (track_less.num != 0)) {
    wVar2 = borg_distance(y * 2,x * 2,*track_less.y * 2,*track_less.x * 2);
    wVar1 = (wVar1 - wVar2) + L'Ϩ';
    if (wVar2 < L'\x04') {
      wVar1 = wVar1 + wVar2 * -500 + L'ߐ';
    }
  }
  return wVar1;
}

Assistant:

int borg_freedom(int y, int x)
{
    int d, f = 0;

    /* Hack -- chase down stairs in town */
    if (!borg.trait[BI_CDEPTH] && track_more.num) {
        /* Love the stairs! */
        d = double_distance(y, x, track_more.y[0], track_more.x[0]);

        /* Proximity is good */
        f += (1000 - d);

        /* Close proximity is great */
        if (d < 4)
            f += (2000 - (d * 500));
    }

    /* Hack -- chase Up Stairs in dungeon */
    if (borg.trait[BI_CDEPTH] && track_less.num) {
        /* Love the stairs! */
        d = double_distance(y, x, track_less.y[0], track_less.x[0]);

        /* Proximity is good */
        f += (1000 - d);

        /* Close proximity is great */
        if (d < 4)
            f += (2000 - (d * 500));
    }

    /* Freedom */
    return (f);
}